

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  vfloat<4> vVar5;
  float *pfVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  byte bVar25;
  int iVar26;
  float *vertices;
  long lVar27;
  byte bVar28;
  NodeRef root;
  size_t sVar29;
  size_t sVar30;
  ulong uVar31;
  long lVar32;
  uint uVar33;
  NodeRef *pNVar34;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar35;
  undefined4 uVar36;
  byte bVar37;
  ulong uVar38;
  bool bVar39;
  byte bVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  vint4 ai_2;
  undefined1 auVar57 [64];
  vint4 bi;
  undefined1 in_ZMM2 [64];
  vint4 bi_1;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 bi_3;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  vint4 ai;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vint4 bi_2;
  undefined1 auVar65 [16];
  vint4 ai_1;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vint4 ai_3;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar82 [64];
  Precalculations pre;
  vuint<4> *v;
  undefined1 local_1988 [16];
  BVH *local_1970;
  Intersectors *local_1968;
  ulong local_1960;
  ulong local_1958;
  Scene *local_1950;
  int local_1948;
  int iStack_1944;
  int iStack_1940;
  int iStack_193c;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_false> tray;
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [8];
  float fStack_17a0;
  float fStack_179c;
  undefined1 local_1798 [8];
  float fStack_1790;
  float fStack_178c;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_1970 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1970->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar46 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar54 = ZEXT816(0) << 0x40;
    uVar15 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar54,5);
    uVar41 = vpcmpeqd_avx512vl(auVar46,(undefined1  [16])valid_i->field_0);
    uVar41 = ((byte)uVar15 & 0xf) & uVar41;
    bVar40 = (byte)uVar41;
    if (bVar40 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x40))->v;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x50))->v;
      tray.dir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x60))->v;
      auVar48._8_4_ = 0x7fffffff;
      auVar48._0_8_ = 0x7fffffff7fffffff;
      auVar48._12_4_ = 0x7fffffff;
      auVar46 = vandps_avx(auVar48,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar44._8_4_ = 0x219392ef;
      auVar44._0_8_ = 0x219392ef219392ef;
      auVar44._12_4_ = 0x219392ef;
      uVar38 = vcmpps_avx512vl(auVar46,auVar44,1);
      bVar39 = (bool)((byte)uVar38 & 1);
      auVar45._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * tray.dir.field_0._0_4_;
      bVar39 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar45._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * tray.dir.field_0._4_4_;
      bVar39 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar45._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * tray.dir.field_0._8_4_;
      bVar39 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar45._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * tray.dir.field_0._12_4_;
      auVar46 = vandps_avx(auVar48,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      uVar38 = vcmpps_avx512vl(auVar46,auVar44,1);
      bVar39 = (bool)((byte)uVar38 & 1);
      auVar42._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * tray.dir.field_0._16_4_;
      bVar39 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * tray.dir.field_0._20_4_;
      bVar39 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * tray.dir.field_0._24_4_;
      bVar39 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar42._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * tray.dir.field_0._28_4_;
      auVar46 = vandps_avx(auVar48,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      uVar38 = vcmpps_avx512vl(auVar46,auVar44,1);
      bVar39 = (bool)((byte)uVar38 & 1);
      auVar43._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * tray.dir.field_0._32_4_;
      bVar39 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar43._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * tray.dir.field_0._36_4_;
      bVar39 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar43._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * tray.dir.field_0._40_4_;
      bVar39 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar43._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * tray.dir.field_0._44_4_;
      auVar44 = vrcp14ps_avx512vl(auVar45);
      auVar47._8_4_ = 0x3f800000;
      auVar47._0_8_ = 0x3f8000003f800000;
      auVar47._12_4_ = 0x3f800000;
      auVar46 = vfnmadd213ps_fma(auVar45,auVar44,auVar47);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar46,auVar44,auVar44)
      ;
      auVar45 = vrcp14ps_avx512vl(auVar42);
      auVar46 = vfnmadd213ps_fma(auVar42,auVar45,auVar47);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar46,auVar45,auVar45)
      ;
      auVar45 = vrcp14ps_avx512vl(auVar43);
      auVar46 = vfnmadd213ps_fma(auVar43,auVar45,auVar47);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar46,auVar45,auVar45)
      ;
      uVar38 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar54,1);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar46._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar38 & 1) * auVar46._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar46._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar46._12_4_;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      uVar38 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar54,5);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar39 = (bool)((byte)uVar38 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar39 * auVar46._0_4_ | (uint)!bVar39 * 0x30;
      bVar39 = (bool)((byte)(uVar38 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar39 * auVar46._4_4_ | (uint)!bVar39 * 0x30;
      bVar39 = (bool)((byte)(uVar38 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar39 * auVar46._8_4_ | (uint)!bVar39 * 0x30;
      bVar39 = (bool)((byte)(uVar38 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar39 * auVar46._12_4_ | (uint)!bVar39 * 0x30;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      uVar38 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar54,5);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar39 = (bool)((byte)uVar38 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar39 * auVar46._0_4_ | (uint)!bVar39 * 0x50;
      bVar39 = (bool)((byte)(uVar38 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar39 * auVar46._4_4_ | (uint)!bVar39 * 0x50;
      bVar39 = (bool)((byte)(uVar38 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar39 * auVar46._8_4_ | (uint)!bVar39 * 0x50;
      bVar39 = (bool)((byte)(uVar38 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar39 * auVar46._12_4_ | (uint)!bVar39 * 0x50;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar80 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar46 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar54);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar40 & 1) * auVar46._0_4_ |
           (uint)!(bool)(bVar40 & 1) * stack_near[0].field_0._0_4_;
      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar39 * auVar46._4_4_ | (uint)!bVar39 * stack_near[0].field_0._4_4_;
      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar39 * auVar46._8_4_ | (uint)!bVar39 * stack_near[0].field_0._8_4_;
      bVar39 = SUB81(uVar41 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar39 * auVar46._12_4_ | (uint)!bVar39 * stack_near[0].field_0._12_4_;
      auVar46 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar54);
      tray.tfar.field_0.i[0] =
           (uint)(bVar40 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar40 & 1) * -0x800000;
      bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar39 * auVar46._4_4_ | (uint)!bVar39 * -0x800000;
      bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar39 * auVar46._8_4_ | (uint)!bVar39 * -0x800000;
      bVar39 = SUB81(uVar41 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar39 * auVar46._12_4_ | (uint)!bVar39 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar33 = 3;
      }
      else {
        uVar33 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      bVar37 = (byte)((ushort)((short)uVar41 << 0xc) >> 0xc) ^ 0xf;
      pNVar34 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar35 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar81 = ZEXT1664(auVar46);
      auVar46 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      auVar82 = ZEXT1664(auVar46);
      local_1968 = This;
LAB_01f3b999:
      do {
        do {
          root.ptr = pNVar34[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01f3c26d;
          pNVar34 = pNVar34 + -1;
          paVar35 = paVar35 + -1;
          vVar5.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar35->v;
          auVar57 = ZEXT1664((undefined1  [16])vVar5.field_0);
          uVar41 = vcmpps_avx512vl((undefined1  [16])vVar5.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar41 == '\0');
        uVar36 = (undefined4)uVar41;
        if (uVar33 < (uint)POPCOUNT(uVar36)) {
LAB_01f3b9dd:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01f3c26d;
              uVar15 = vcmpps_avx512vl(auVar57._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar15 == '\0') goto LAB_01f3b999;
              bVar25 = bVar37 & 0xf;
              local_1960 = (ulong)((uint)root.ptr & 0xf) - 8;
              if (local_1960 == 0) goto LAB_01f3c23d;
              bVar25 = bVar25 ^ 0xf;
              lVar32 = (root.ptr & 0xfffffffffffffff0) + 0x40;
              uVar41 = 0;
              goto LAB_01f3bc82;
            }
            lVar32 = 0;
            sVar30 = 8;
            auVar46 = auVar80._0_16_;
            do {
              sVar29 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar32 * 8);
              if (sVar29 == 8) {
                auVar57 = ZEXT1664(auVar46);
                sVar29 = sVar30;
                break;
              }
              auVar22._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar22._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar22._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar22._12_4_ = tray.org_rdir.field_0._12_4_;
              uVar36 = *(undefined4 *)(root.ptr + 0x20 + lVar32 * 4);
              auVar62._4_4_ = uVar36;
              auVar62._0_4_ = uVar36;
              auVar62._8_4_ = uVar36;
              auVar62._12_4_ = uVar36;
              auVar42 = vfmsub132ps_fma(auVar62,auVar22,
                                        (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
              uVar36 = *(undefined4 *)(root.ptr + 0x40 + lVar32 * 4);
              auVar66._4_4_ = uVar36;
              auVar66._0_4_ = uVar36;
              auVar66._8_4_ = uVar36;
              auVar66._12_4_ = uVar36;
              auVar23._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar23._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar23._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar23._12_4_ = tray.org_rdir.field_0._44_4_;
              uVar36 = *(undefined4 *)(root.ptr + 0x60 + lVar32 * 4);
              auVar68._4_4_ = uVar36;
              auVar68._0_4_ = uVar36;
              auVar68._8_4_ = uVar36;
              auVar68._12_4_ = uVar36;
              auVar43 = vfmsub132ps_fma(auVar66,(undefined1  [16])
                                                tray.org_rdir.field_0.field_0.y.field_0,
                                        (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
              auVar44 = vfmsub132ps_fma(auVar68,auVar23,
                                        (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
              uVar36 = *(undefined4 *)(root.ptr + 0x30 + lVar32 * 4);
              auVar17._4_4_ = uVar36;
              auVar17._0_4_ = uVar36;
              auVar17._8_4_ = uVar36;
              auVar17._12_4_ = uVar36;
              auVar47 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar22,
                                   auVar17);
              uVar36 = *(undefined4 *)(root.ptr + 0x50 + lVar32 * 4);
              auVar18._4_4_ = uVar36;
              auVar18._0_4_ = uVar36;
              auVar18._8_4_ = uVar36;
              auVar18._12_4_ = uVar36;
              auVar48 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                   (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0,auVar18
                                  );
              uVar36 = *(undefined4 *)(root.ptr + 0x70 + lVar32 * 4);
              auVar19._4_4_ = uVar36;
              auVar19._0_4_ = uVar36;
              auVar19._8_4_ = uVar36;
              auVar19._12_4_ = uVar36;
              auVar49 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar23,
                                   auVar19);
              auVar54 = vpminsd_avx(auVar42,auVar47);
              auVar45 = vpminsd_avx(auVar43,auVar48);
              auVar54 = vpmaxsd_avx(auVar54,auVar45);
              auVar45 = vpminsd_avx(auVar44,auVar49);
              auVar54 = vpmaxsd_avx(auVar54,auVar45);
              auVar45 = vpmaxsd_avx(auVar42,auVar47);
              auVar42 = vpmaxsd_avx(auVar43,auVar48);
              auVar42 = vpminsd_avx(auVar45,auVar42);
              auVar45 = vpmaxsd_avx(auVar44,auVar49);
              auVar42 = vpminsd_avx(auVar42,auVar45);
              auVar45 = vpmaxsd_avx(auVar54,(undefined1  [16])tray.tnear.field_0);
              auVar42 = vpminsd_avx(auVar42,(undefined1  [16])tray.tfar.field_0);
              uVar41 = vpcmpd_avx512vl(auVar45,auVar42,2);
              uVar41 = uVar41 & 0xf;
              if ((byte)uVar41 == 0) {
                auVar57 = ZEXT1664(auVar46);
                sVar29 = sVar30;
              }
              else {
                auVar45 = vblendmps_avx512vl(auVar80._0_16_,auVar54);
                bVar39 = (bool)((byte)uVar41 & 1);
                bVar9 = (bool)((byte)(uVar41 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar41 >> 2) & 1);
                bVar11 = SUB81(uVar41 >> 3,0);
                auVar57 = ZEXT1664(CONCAT412((uint)bVar11 * auVar45._12_4_ |
                                             (uint)!bVar11 * auVar54._12_4_,
                                             CONCAT48((uint)bVar10 * auVar45._8_4_ |
                                                      (uint)!bVar10 * auVar54._8_4_,
                                                      CONCAT44((uint)bVar9 * auVar45._4_4_ |
                                                               (uint)!bVar9 * auVar54._4_4_,
                                                               (uint)bVar39 * auVar45._0_4_ |
                                                               (uint)!bVar39 * auVar54._0_4_))));
                if (sVar30 != 8) {
                  pNVar34->ptr = sVar30;
                  pNVar34 = pNVar34 + 1;
                  *(undefined1 (*) [16])paVar35->v = auVar46;
                  paVar35 = paVar35 + 1;
                }
              }
              lVar32 = lVar32 + 1;
              auVar46 = auVar57._0_16_;
              sVar30 = sVar29;
            } while (lVar32 != 4);
            iVar26 = 4;
            if (sVar29 == 8) goto LAB_01f3bb4c;
            uVar15 = vcmpps_avx512vl((undefined1  [16])auVar57._0_16_,
                                     (undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar29;
          } while ((byte)uVar33 < (byte)POPCOUNT((int)uVar15));
          pNVar34->ptr = sVar29;
          pNVar34 = pNVar34 + 1;
          *paVar35 = auVar57._0_16_;
          paVar35 = paVar35 + 1;
        }
        else {
          do {
            sVar30 = 0;
            for (uVar38 = uVar41; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
              sVar30 = sVar30 + 1;
            }
            bVar39 = occluded1(local_1968,local_1970,root,sVar30,&pre,ray,&tray,context);
            bVar25 = (byte)(1 << ((uint)sVar30 & 0x1f));
            if (!bVar39) {
              bVar25 = 0;
            }
            bVar37 = bVar37 | bVar25;
            uVar41 = uVar41 - 1 & uVar41;
          } while (uVar41 != 0);
          iVar26 = 3;
          if (bVar37 != 0xf) {
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar37 & 1) * auVar46._0_4_ |
                 (uint)!(bool)(bVar37 & 1) * tray.tfar.field_0.i[0];
            bVar39 = (bool)(bVar37 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar39 * auVar46._4_4_ | (uint)!bVar39 * tray.tfar.field_0.i[1];
            bVar39 = (bool)(bVar37 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar39 * auVar46._8_4_ | (uint)!bVar39 * tray.tfar.field_0.i[2];
            bVar39 = (bool)(bVar37 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar39 * auVar46._12_4_ | (uint)!bVar39 * tray.tfar.field_0.i[3];
            iVar26 = 2;
          }
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar80 = ZEXT1664(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar81 = ZEXT1664(auVar46);
          auVar46 = vxorps_avx512vl(auVar82._0_16_,auVar82._0_16_);
          auVar82 = ZEXT1664(auVar46);
          auVar57 = ZEXT1664((undefined1  [16])vVar5.field_0);
          if (uVar33 < (uint)POPCOUNT(uVar36)) goto LAB_01f3b9dd;
        }
LAB_01f3bb4c:
      } while ((iVar26 == 4) || (iVar26 == 2));
LAB_01f3c26d:
      bVar37 = bVar37 & bVar40;
      bVar39 = (bool)(bVar37 >> 1 & 1);
      bVar9 = (bool)(bVar37 >> 2 & 1);
      *(uint *)pRVar1 = (uint)(bVar37 & 1) * -0x800000 | (uint)!(bool)(bVar37 & 1) * *(int *)pRVar1;
      *(uint *)(ray + 0x84) = (uint)bVar39 * -0x800000 | (uint)!bVar39 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar37 >> 3) * -0x800000 | (uint)!(bool)(bVar37 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
  while( true ) {
    uVar41 = local_1958 + 1;
    lVar32 = lVar32 + 0x50;
    if (local_1960 <= uVar41) break;
LAB_01f3bc82:
    lVar27 = uVar41 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    local_1950 = context->scene;
    uVar38 = 0;
    local_1958 = uVar41;
    bVar28 = bVar25;
    while (*(int *)(lVar32 + uVar38 * 4) != -1) {
      pfVar6 = (local_1950->vertices).items[*(uint *)(lVar32 + -0x10 + uVar38 * 4)];
      uVar41 = (ulong)*(uint *)(lVar32 + -0x40 + uVar38 * 4);
      fVar2 = pfVar6[uVar41];
      auVar58._4_4_ = fVar2;
      auVar58._0_4_ = fVar2;
      auVar58._8_4_ = fVar2;
      auVar58._12_4_ = fVar2;
      uVar31 = (ulong)*(uint *)(lVar32 + -0x30 + uVar38 * 4);
      fVar3 = pfVar6[uVar41 + 1];
      auVar60._4_4_ = fVar3;
      auVar60._0_4_ = fVar3;
      auVar60._8_4_ = fVar3;
      auVar60._12_4_ = fVar3;
      fVar4 = pfVar6[uVar41 + 2];
      auVar63._4_4_ = fVar4;
      auVar63._0_4_ = fVar4;
      auVar63._8_4_ = fVar4;
      auVar63._12_4_ = fVar4;
      uVar41 = (ulong)*(uint *)(lVar32 + -0x20 + uVar38 * 4);
      fVar12 = fVar2 - pfVar6[uVar31];
      fVar13 = fVar3 - pfVar6[uVar31 + 1];
      fVar14 = fVar4 - pfVar6[uVar31 + 2];
      local_1778 = *(undefined8 *)(lVar27 + 0x30);
      uStack_1770 = *(undefined8 *)(lVar27 + 0x38);
      auVar65._4_4_ = fVar12;
      auVar65._0_4_ = fVar12;
      auVar65._8_4_ = fVar12;
      auVar65._12_4_ = fVar12;
      auVar67._4_4_ = fVar13;
      auVar67._0_4_ = fVar13;
      auVar67._8_4_ = fVar13;
      auVar67._12_4_ = fVar13;
      auVar53._4_4_ = fVar14;
      auVar53._0_4_ = fVar14;
      auVar53._8_4_ = fVar14;
      auVar53._12_4_ = fVar14;
      fVar2 = pfVar6[uVar41] - fVar2;
      auVar79._4_4_ = fVar2;
      auVar79._0_4_ = fVar2;
      auVar79._8_4_ = fVar2;
      auVar79._12_4_ = fVar2;
      auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(pfVar6[uVar41 + 1] - fVar3)));
      auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)(pfVar6[uVar41 + 2] - fVar4)));
      fVar13 = fVar13 * (pfVar6[uVar41 + 2] - fVar4);
      auVar46._4_4_ = fVar13;
      auVar46._0_4_ = fVar13;
      auVar46._8_4_ = fVar13;
      auVar46._12_4_ = fVar13;
      auVar52 = vfmsub231ps_avx512vl(auVar46,auVar50,auVar53);
      fVar2 = fVar14 * fVar2;
      auVar54._4_4_ = fVar2;
      auVar54._0_4_ = fVar2;
      auVar54._8_4_ = fVar2;
      auVar54._12_4_ = fVar2;
      auVar53 = vfmsub231ps_avx512vl(auVar54,auVar51,auVar65);
      fVar12 = (pfVar6[uVar41 + 1] - fVar3) * fVar12;
      auVar49._4_4_ = fVar12;
      auVar49._0_4_ = fVar12;
      auVar49._8_4_ = fVar12;
      auVar49._12_4_ = fVar12;
      auVar47 = vfmsub231ps_fma(auVar49,auVar79,auVar67);
      auVar42 = vsubps_avx(auVar58,*(undefined1 (*) [16])ray);
      auVar43 = vsubps_avx(auVar60,*(undefined1 (*) [16])(ray + 0x10));
      auVar44 = vsubps_avx(auVar63,*(undefined1 (*) [16])(ray + 0x20));
      auVar46 = *(undefined1 (*) [16])(ray + 0x40);
      auVar54 = *(undefined1 (*) [16])(ray + 0x50);
      auVar45 = *(undefined1 (*) [16])(ray + 0x60);
      auVar76._0_4_ = auVar54._0_4_ * auVar44._0_4_;
      auVar76._4_4_ = auVar54._4_4_ * auVar44._4_4_;
      auVar76._8_4_ = auVar54._8_4_ * auVar44._8_4_;
      auVar76._12_4_ = auVar54._12_4_ * auVar44._12_4_;
      auVar48 = vfmsub231ps_fma(auVar76,auVar43,auVar45);
      auVar77._0_4_ = auVar45._0_4_ * auVar42._0_4_;
      auVar77._4_4_ = auVar45._4_4_ * auVar42._4_4_;
      auVar77._8_4_ = auVar45._8_4_ * auVar42._8_4_;
      auVar77._12_4_ = auVar45._12_4_ * auVar42._12_4_;
      auVar49 = vfmsub231ps_fma(auVar77,auVar44,auVar46);
      auVar78._0_4_ = auVar46._0_4_ * auVar43._0_4_;
      auVar78._4_4_ = auVar46._4_4_ * auVar43._4_4_;
      auVar78._8_4_ = auVar46._8_4_ * auVar43._8_4_;
      auVar78._12_4_ = auVar46._12_4_ * auVar43._12_4_;
      auVar58 = vfmsub231ps_fma(auVar78,auVar42,auVar54);
      auVar64._0_4_ = auVar47._0_4_ * auVar45._0_4_;
      auVar64._4_4_ = auVar47._4_4_ * auVar45._4_4_;
      auVar64._8_4_ = auVar47._8_4_ * auVar45._8_4_;
      auVar64._12_4_ = auVar47._12_4_ * auVar45._12_4_;
      auVar54 = vfmadd231ps_fma(auVar64,auVar53,auVar54);
      auVar46 = vfmadd231ps_fma(auVar54,auVar52,auVar46);
      auVar45 = vandps_avx512vl(auVar46,auVar81._0_16_);
      auVar54 = vmulps_avx512vl(auVar51,auVar58);
      auVar54 = vfmadd231ps_avx512vl(auVar54,auVar49,auVar50);
      auVar54 = vfmadd231ps_fma(auVar54,auVar48,auVar79);
      uVar72 = auVar45._0_4_;
      auVar50._0_4_ = uVar72 ^ auVar54._0_4_;
      uVar73 = auVar45._4_4_;
      auVar50._4_4_ = uVar73 ^ auVar54._4_4_;
      uVar74 = auVar45._8_4_;
      auVar50._8_4_ = uVar74 ^ auVar54._8_4_;
      uVar75 = auVar45._12_4_;
      auVar50._12_4_ = uVar75 ^ auVar54._12_4_;
      auVar54 = auVar82._0_16_;
      uVar15 = vcmpps_avx512vl(auVar50,auVar54,5);
      bVar24 = (byte)uVar15 & bVar28;
      if (bVar24 == 0) {
LAB_01f3be0b:
        bVar24 = 0;
      }
      else {
        auVar71._0_4_ = fVar14 * auVar58._0_4_;
        auVar71._4_4_ = fVar14 * auVar58._4_4_;
        auVar71._8_4_ = fVar14 * auVar58._8_4_;
        auVar71._12_4_ = fVar14 * auVar58._12_4_;
        auVar45 = vfmadd213ps_fma(auVar49,auVar67,auVar71);
        auVar45 = vfmadd213ps_fma(auVar48,auVar65,auVar45);
        auVar51._0_4_ = uVar72 ^ auVar45._0_4_;
        auVar51._4_4_ = uVar73 ^ auVar45._4_4_;
        auVar51._8_4_ = uVar74 ^ auVar45._8_4_;
        auVar51._12_4_ = uVar75 ^ auVar45._12_4_;
        uVar15 = vcmpps_avx512vl(auVar51,auVar54,5);
        bVar24 = bVar24 & (byte)uVar15;
        if (bVar24 == 0) goto LAB_01f3be0b;
        auVar21._8_4_ = 0x7fffffff;
        auVar21._0_8_ = 0x7fffffff7fffffff;
        auVar21._12_4_ = 0x7fffffff;
        auVar48 = vandps_avx512vl(auVar46,auVar21);
        auVar45 = vsubps_avx(auVar48,auVar50);
        uVar15 = vcmpps_avx512vl(auVar45,auVar51,5);
        bVar24 = bVar24 & (byte)uVar15;
        if (bVar24 == 0) goto LAB_01f3be0b;
        auVar69._0_4_ = auVar44._0_4_ * auVar47._0_4_;
        auVar69._4_4_ = auVar44._4_4_ * auVar47._4_4_;
        auVar69._8_4_ = auVar44._8_4_ * auVar47._8_4_;
        auVar69._12_4_ = auVar44._12_4_ * auVar47._12_4_;
        auVar45 = vfmadd213ps_fma(auVar43,auVar53,auVar69);
        auVar45 = vfmadd213ps_fma(auVar42,auVar52,auVar45);
        auVar61._0_4_ = auVar48._0_4_ * *(float *)(ray + 0x30);
        auVar61._4_4_ = auVar48._4_4_ * *(float *)(ray + 0x34);
        auVar61._8_4_ = auVar48._8_4_ * *(float *)(ray + 0x38);
        auVar61._12_4_ = auVar48._12_4_ * *(float *)(ray + 0x3c);
        auVar59._0_4_ = uVar72 ^ auVar45._0_4_;
        auVar59._4_4_ = uVar73 ^ auVar45._4_4_;
        auVar59._8_4_ = uVar74 ^ auVar45._8_4_;
        auVar59._12_4_ = uVar75 ^ auVar45._12_4_;
        auVar70._0_4_ = auVar48._0_4_ * *(float *)(ray + 0x80);
        auVar70._4_4_ = auVar48._4_4_ * *(float *)(ray + 0x84);
        auVar70._8_4_ = auVar48._8_4_ * *(float *)(ray + 0x88);
        auVar70._12_4_ = auVar48._12_4_ * *(float *)(ray + 0x8c);
        uVar15 = vcmpps_avx512vl(auVar59,auVar70,2);
        uVar16 = vcmpps_avx512vl(auVar61,auVar59,1);
        bVar24 = bVar24 & (byte)uVar15 & (byte)uVar16;
        if (bVar24 == 0) {
LAB_01f3c206:
          bVar24 = 0;
          auVar47 = local_17f8;
          auVar53 = local_17e8;
          auVar52 = local_17d8;
          auVar48 = local_17c8;
          auVar59 = local_17b8;
          auVar51 = _local_17a8;
          auVar50 = _local_1798;
        }
        else {
          uVar15 = vcmpps_avx512vl(auVar46,ZEXT816(0) << 0x20,4);
          bVar24 = bVar24 & (byte)uVar15;
          if (bVar24 == 0) goto LAB_01f3c206;
        }
        _local_1798 = auVar50;
        _local_17a8 = auVar51;
        local_17b8 = auVar59;
        local_17c8 = auVar48;
        local_17d8 = auVar52;
        local_17e8 = auVar53;
        local_17f8 = auVar47;
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar80 = ZEXT1664(auVar46);
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar81 = ZEXT1664(auVar46);
        auVar46 = vxorps_avx512vl(auVar54,auVar54);
        auVar82 = ZEXT1664(auVar46);
      }
      auVar46 = auVar82._0_16_;
      pGVar7 = (context->scene->geometries).items[*(uint *)((long)&local_1778 + uVar38 * 4)].ptr;
      uVar72 = pGVar7->mask;
      auVar52._4_4_ = uVar72;
      auVar52._0_4_ = uVar72;
      auVar52._8_4_ = uVar72;
      auVar52._12_4_ = uVar72;
      uVar15 = vptestmd_avx512vl(auVar52,*(undefined1 (*) [16])(ray + 0x90));
      bVar24 = (byte)uVar15 & 0xf & bVar24;
      if (bVar24 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar54 = vrcp14ps_avx512vl(local_17c8);
          auVar20._8_4_ = 0x3f800000;
          auVar20._0_8_ = 0x3f8000003f800000;
          auVar20._12_4_ = 0x3f800000;
          auVar45 = vfnmadd213ps_avx512vl(auVar54,local_17c8,auVar20);
          auVar54 = vfmadd132ps_fma(auVar45,auVar54,auVar54);
          local_1738._0_4_ = auVar54._0_4_ * (float)local_1798._0_4_;
          local_1738._4_4_ = auVar54._4_4_ * (float)local_1798._4_4_;
          local_1738._8_4_ = auVar54._8_4_ * fStack_1790;
          local_1738._12_4_ = auVar54._12_4_ * fStack_178c;
          local_1708 = vpbroadcastd_avx512vl();
          local_1718 = vpbroadcastd_avx512vl();
          local_1768 = local_17d8._0_8_;
          uStack_1760 = local_17d8._8_8_;
          local_1758 = local_17e8._0_8_;
          uStack_1750 = local_17e8._8_8_;
          local_1748 = local_17f8;
          local_1728 = auVar54._0_4_ * (float)local_17a8._0_4_;
          fStack_1724 = auVar54._4_4_ * (float)local_17a8._4_4_;
          fStack_1720 = auVar54._8_4_ * fStack_17a0;
          fStack_171c = auVar54._12_4_ * fStack_179c;
          vpcmpeqd_avx2(ZEXT1632(local_1738),ZEXT1632(local_1738));
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          local_1948 = *(int *)(ray + 0x80);
          iStack_1944 = *(int *)(ray + 0x84);
          iStack_1940 = *(int *)(ray + 0x88);
          iStack_193c = *(int *)(ray + 0x8c);
          auVar54 = vmulps_avx512vl(auVar54,local_17b8);
          bVar39 = (bool)(bVar24 >> 1 & 1);
          bVar9 = (bool)(bVar24 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)(bVar24 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar24 & 1) * local_1948;
          *(uint *)(ray + 0x84) = (uint)bVar39 * auVar54._4_4_ | (uint)!bVar39 * iStack_1944;
          *(uint *)(ray + 0x88) = (uint)bVar9 * auVar54._8_4_ | (uint)!bVar9 * iStack_1940;
          *(uint *)(ray + 0x8c) =
               (uint)(bVar24 >> 3) * auVar54._12_4_ | (uint)!(bool)(bVar24 >> 3) * iStack_193c;
          local_1988 = vpmovm2d_avx512vl((ulong)bVar24);
          args.valid = (int *)local_1988;
          args.geometryUserPtr = pGVar7->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar7->occlusionFilterN)(&args);
            auVar46 = vxorps_avx512vl(auVar46,auVar46);
            auVar82 = ZEXT1664(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar81 = ZEXT1664(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar80 = ZEXT1664(auVar46);
          }
          auVar46 = auVar82._0_16_;
          uVar41 = vptestmd_avx512vl(local_1988,local_1988);
          if ((uVar41 & 0xf) == 0) {
            uVar41 = 0;
          }
          else {
            p_Var8 = context->args->filter;
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var8)(&args);
              auVar46 = vxorps_avx512vl(auVar46,auVar46);
              auVar82 = ZEXT1664(auVar46);
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar81 = ZEXT1664(auVar46);
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar80 = ZEXT1664(auVar46);
            }
            uVar41 = vptestmd_avx512vl(local_1988,local_1988);
            uVar41 = uVar41 & 0xf;
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar39 = (bool)((byte)uVar41 & 1);
            auVar55._0_4_ = (uint)bVar39 * auVar46._0_4_ | (uint)!bVar39 * *(int *)(args.ray + 0x80)
            ;
            bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar55._4_4_ = (uint)bVar39 * auVar46._4_4_ | (uint)!bVar39 * *(int *)(args.ray + 0x84)
            ;
            bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar55._8_4_ = (uint)bVar39 * auVar46._8_4_ | (uint)!bVar39 * *(int *)(args.ray + 0x88)
            ;
            bVar39 = SUB81(uVar41 >> 3,0);
            auVar55._12_4_ =
                 (uint)bVar39 * auVar46._12_4_ | (uint)!bVar39 * *(int *)(args.ray + 0x8c);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar55;
          }
          bVar24 = (byte)uVar41;
          auVar56._0_4_ =
               (uint)(bVar24 & 1) * *(int *)pRVar1 | (uint)!(bool)(bVar24 & 1) * local_1948;
          bVar39 = (bool)((byte)(uVar41 >> 1) & 1);
          auVar56._4_4_ = (uint)bVar39 * *(int *)(ray + 0x84) | (uint)!bVar39 * iStack_1944;
          bVar39 = (bool)((byte)(uVar41 >> 2) & 1);
          auVar56._8_4_ = (uint)bVar39 * *(int *)(ray + 0x88) | (uint)!bVar39 * iStack_1940;
          bVar39 = SUB81(uVar41 >> 3,0);
          auVar56._12_4_ = (uint)bVar39 * *(int *)(ray + 0x8c) | (uint)!bVar39 * iStack_193c;
          *(undefined1 (*) [16])pRVar1 = auVar56;
        }
        bVar28 = (bVar24 ^ 0xf) & bVar28;
      }
      if ((bVar28 == 0) || (bVar39 = 2 < uVar38, uVar38 = uVar38 + 1, bVar39)) break;
    }
    bVar25 = bVar25 & bVar28;
    if (bVar25 == 0) break;
  }
  bVar25 = bVar25 ^ 0xf;
LAB_01f3c23d:
  bVar37 = bVar25 | bVar37;
  if (bVar37 == 0xf) {
    bVar37 = 0xf;
    goto LAB_01f3c26d;
  }
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  tray.tfar.field_0.i[0] =
       (uint)(bVar37 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar37 & 1) * tray.tfar.field_0.i[0];
  bVar39 = (bool)(bVar37 >> 1 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar39 * auVar46._4_4_ | (uint)!bVar39 * tray.tfar.field_0.i[1];
  bVar39 = (bool)(bVar37 >> 2 & 1);
  tray.tfar.field_0.i[2] = (uint)bVar39 * auVar46._8_4_ | (uint)!bVar39 * tray.tfar.field_0.i[2];
  bVar39 = (bool)(bVar37 >> 3 & 1);
  tray.tfar.field_0.i[3] = (uint)bVar39 * auVar46._12_4_ | (uint)!bVar39 * tray.tfar.field_0.i[3];
  goto LAB_01f3b999;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }